

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O0

adt_u32List_elem_t *
adt_u32List_elem_new(uint32_t item,adt_u32List_elem_t *pNext,adt_u32List_elem_t *pPrev)

{
  adt_u32List_elem_t *self_00;
  int *piVar1;
  adt_u32List_elem_t *self;
  adt_u32List_elem_t *pPrev_local;
  adt_u32List_elem_t *pNext_local;
  uint32_t item_local;
  
  self_00 = (adt_u32List_elem_t *)malloc(0x18);
  if (self_00 == (adt_u32List_elem_t *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xc;
  }
  else {
    adt_u32List_elem_create(self_00,item,pNext,pPrev);
  }
  return self_00;
}

Assistant:

static adt_u32List_elem_t*  adt_u32List_elem_new(uint32_t item, adt_u32List_elem_t *pNext, adt_u32List_elem_t *pPrev)
{
   adt_u32List_elem_t *self = (adt_u32List_elem_t*) malloc(sizeof(adt_u32List_elem_t));
   if (self != 0)
   {
      adt_u32List_elem_create(self,item,pNext,pPrev);
   }
   else
   {
      errno = ENOMEM;
   }
   return self;
}